

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_function_apply(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSValue new_target;
  JSValue func_obj;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue func_obj_00;
  JSValue func_obj_01;
  JSValue array_arg_00;
  int iVar1;
  JSContext *ctx_00;
  undefined4 in_ECX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  int64_t *in_R8;
  uint in_R9D;
  JSValue JVar2;
  JSValue ret;
  JSValue *tab;
  uint32_t len;
  JSValue array_arg;
  JSValue this_arg;
  JSValueUnion ctx_01;
  undefined1 in_stack_ffffffffffffff60 [16];
  JSValueUnion in_stack_ffffffffffffff70;
  JSValueUnion in_stack_ffffffffffffff78;
  int64_t in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  JSContext *in_stack_ffffffffffffff90;
  JSValueUnion in_stack_ffffffffffffff98;
  int64_t iVar3;
  JSValueUnion JVar4;
  JSValue *argv_00;
  undefined4 in_stack_ffffffffffffffd0;
  JSValueUnion local_10;
  int64_t local_8;
  
  JVar2.tag = (int64_t)in_stack_ffffffffffffff78.ptr;
  JVar2.u.ptr = in_stack_ffffffffffffff70.ptr;
  iVar1 = check_function(in_stack_ffffffffffffff60._8_8_,JVar2);
  if (iVar1 == 0) {
    argv_00 = (JSValue *)*in_R8;
    iVar3 = in_R8[2];
    JVar4 = *(JSValueUnion *)(in_R8 + 3);
    if (((JVar4.int32 == 3) || (JVar4.int32 == 2)) && (in_R9D != 2)) {
      func_obj_00.tag = (int64_t)argv_00;
      func_obj_00.u.float64 = JVar4.float64;
      this_obj.tag = iVar3;
      this_obj.u.ptr = in_stack_ffffffffffffff98.ptr;
      _local_10 = JS_Call(in_stack_ffffffffffffff90,func_obj_00,this_obj,in_stack_ffffffffffffff8c,
                          (JSValue *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0));
    }
    else {
      array_arg_00.tag = in_RDX;
      array_arg_00.u.float64 = in_RSI.float64;
      ctx_00 = (JSContext *)
               build_arg_list(in_RDI,(uint32_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0),
                              array_arg_00);
      ctx_01 = in_stack_ffffffffffffff60._0_8_;
      if (ctx_00 == (JSContext *)0x0) {
        local_10.ptr = (void *)(local_10 << 0x20);
        local_8 = 6;
      }
      else {
        if ((in_R9D & 1) == 0) {
          func_obj_01.tag = (int64_t)argv_00;
          func_obj_01.u.float64 = JVar4.float64;
          this_obj_00.tag = iVar3;
          this_obj_00.u.ptr = in_stack_ffffffffffffff98.ptr;
          JVar2 = JS_Call(ctx_00,func_obj_01,this_obj_00,in_stack_ffffffffffffff8c,
                          (JSValue *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0));
          local_10 = JVar2.u;
          local_8._0_4_ = (undefined4)JVar2.tag;
          local_8._4_4_ = JVar2.tag._4_4_;
          ctx_01 = local_10;
        }
        else {
          func_obj.u._4_4_ = in_stack_ffffffffffffff8c;
          func_obj.u.int32 = in_stack_ffffffffffffff88;
          func_obj.tag = (int64_t)ctx_00;
          new_target.tag = in_stack_ffffffffffffff80;
          new_target.u.ptr = in_stack_ffffffffffffff78.ptr;
          JVar2 = JS_CallConstructor2((JSContext *)in_stack_ffffffffffffff70.ptr,func_obj,new_target
                                      ,in_stack_ffffffffffffff60._12_4_,argv_00);
          local_10 = JVar2.u;
          local_8._0_4_ = (undefined4)JVar2.tag;
          local_8._4_4_ = JVar2.tag._4_4_;
        }
        free_arg_list((JSContext *)ctx_01.ptr,(JSValue *)ctx_00,0);
      }
    }
  }
  else {
    local_10.ptr = (void *)(local_10 << 0x20);
    local_8 = 6;
  }
  return _local_10;
}

Assistant:

static JSValue js_function_apply(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv, int magic)
{
    JSValueConst this_arg, array_arg;
    uint32_t len;
    JSValue *tab, ret;

    if (check_function(ctx, this_val))
        return JS_EXCEPTION;
    this_arg = argv[0];
    array_arg = argv[1];
    if ((JS_VALUE_GET_TAG(array_arg) == JS_TAG_UNDEFINED ||
         JS_VALUE_GET_TAG(array_arg) == JS_TAG_NULL) && magic != 2) {
        return JS_Call(ctx, this_val, this_arg, 0, NULL);
    }
    tab = build_arg_list(ctx, &len, array_arg);
    if (!tab)
        return JS_EXCEPTION;
    if (magic & 1) {
        ret = JS_CallConstructor2(ctx, this_val, this_arg, len, (JSValueConst *)tab);
    } else {
        ret = JS_Call(ctx, this_val, this_arg, len, (JSValueConst *)tab);
    }
    free_arg_list(ctx, tab, len);
    return ret;
}